

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterIterRead(sqlite3 *db,VdbeSorterIter *p,int nByte,u8 **ppOut)

{
  int iVar1;
  u8 *puVar2;
  u8 *local_58;
  u8 *aNext;
  int nCopy;
  int rc_1;
  int nNew;
  int nRem;
  int rc;
  int nRead;
  int nAvail;
  int iBuf;
  u8 **ppOut_local;
  VdbeSorterIter *pVStack_20;
  int nByte_local;
  VdbeSorterIter *p_local;
  sqlite3 *db_local;
  
  nRead = (int)(p->iReadOff % (long)p->nBuffer);
  _nAvail = ppOut;
  ppOut_local._4_4_ = nByte;
  pVStack_20 = p;
  p_local = (VdbeSorterIter *)db;
  if (nRead == 0) {
    if ((long)p->nBuffer < p->iEof - p->iReadOff) {
      nRem = p->nBuffer;
    }
    else {
      nRem = (int)p->iEof - (int)p->iReadOff;
    }
    iVar1 = sqlite3OsRead(p->pFile,p->aBuffer,nRem,p->iReadOff);
    if (iVar1 != 0) {
      return iVar1;
    }
    nNew = 0;
  }
  rc = pVStack_20->nBuffer - nRead;
  if (rc < ppOut_local._4_4_) {
    if (pVStack_20->nAlloc < ppOut_local._4_4_) {
      nCopy = pVStack_20->nAlloc;
      do {
        nCopy = nCopy << 1;
      } while (nCopy < ppOut_local._4_4_);
      puVar2 = (u8 *)sqlite3DbReallocOrFree((sqlite3 *)p_local,pVStack_20->aAlloc,nCopy);
      pVStack_20->aAlloc = puVar2;
      if (pVStack_20->aAlloc == (u8 *)0x0) {
        return 7;
      }
      pVStack_20->nAlloc = nCopy;
    }
    memcpy(pVStack_20->aAlloc,pVStack_20->aBuffer + nRead,(long)rc);
    pVStack_20->iReadOff = (long)rc + pVStack_20->iReadOff;
    for (rc_1 = ppOut_local._4_4_ - rc; 0 < rc_1; rc_1 = rc_1 - (int)aNext) {
      aNext._0_4_ = rc_1;
      if (pVStack_20->nBuffer < rc_1) {
        aNext._0_4_ = pVStack_20->nBuffer;
      }
      aNext._4_4_ = vdbeSorterIterRead((sqlite3 *)p_local,pVStack_20,(int)aNext,&local_58);
      if (aNext._4_4_ != 0) {
        return aNext._4_4_;
      }
      memcpy(pVStack_20->aAlloc + (ppOut_local._4_4_ - rc_1),local_58,(long)(int)aNext);
    }
    *_nAvail = pVStack_20->aAlloc;
  }
  else {
    *_nAvail = pVStack_20->aBuffer + nRead;
    pVStack_20->iReadOff = (long)ppOut_local._4_4_ + pVStack_20->iReadOff;
  }
  return 0;
}

Assistant:

static int vdbeSorterIterRead(
  sqlite3 *db,                    /* Database handle (for malloc) */
  VdbeSorterIter *p,              /* Iterator */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */
  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next 
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Read data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFile, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf; 

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a 
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      int nNew = p->nAlloc*2;
      while( nByte>nNew ) nNew = nNew*2;
      p->aAlloc = sqlite3DbReallocOrFree(db, p->aAlloc, nNew);
      if( !p->aAlloc ) return SQLITE_NOMEM;
      p->nAlloc = nNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbeSorterIterRead() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbeSorterIterRead(db, p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}